

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# faidx.c
# Opt level: O2

void fai_destroy(faidx_t *fai)

{
  kh_s_t *__ptr;
  int i;
  long lVar1;
  
  for (lVar1 = 0; lVar1 < fai->n; lVar1 = lVar1 + 1) {
    free(fai->name[lVar1]);
  }
  free(fai->name);
  __ptr = fai->hash;
  if (__ptr != (kh_s_t *)0x0) {
    free(__ptr->keys);
    free(__ptr->flags);
    free(__ptr->vals);
    free(__ptr);
  }
  if (fai->bgzf != (BGZF *)0x0) {
    bgzf_close(fai->bgzf);
  }
  free(fai);
  return;
}

Assistant:

void fai_destroy(faidx_t *fai)
{
    int i;
    for (i = 0; i < fai->n; ++i) free(fai->name[i]);
    free(fai->name);
    kh_destroy(s, fai->hash);
    if (fai->bgzf) bgzf_close(fai->bgzf);
    free(fai);
}